

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cinproc.c
# Opt level: O0

void nn_cinproc_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  int iVar1;
  nn_fsm *local_38;
  nn_sinproc *sinproc;
  nn_cinproc *cinproc;
  void *srcptr_local;
  int type_local;
  int src_local;
  nn_fsm *self_local;
  
  local_38 = self;
  if (self == (nn_fsm *)0x0) {
    local_38 = (nn_fsm *)0x0;
  }
  iVar1 = *(int *)&local_38[1].fn;
  if (iVar1 == 1) {
    if (src != -2) {
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
              (ulong)*(uint *)&local_38[1].fn,(ulong)(uint)src,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/inproc/cinproc.c"
              ,0xb2);
      fflush(_stderr);
      nn_err_abort();
    }
    if (type != -2) {
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
              (ulong)*(uint *)&local_38[1].fn,0xfffffffe,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/inproc/cinproc.c"
              ,0xae);
      fflush(_stderr);
      nn_err_abort();
    }
    *(undefined4 *)&local_38[1].fn = 2;
    nn_epbase_stat_increment((nn_epbase *)&local_38[1].shutdown_fn,0xca,1);
  }
  else if (iVar1 == 2) {
    if (src == -2) {
      if (type != 1) {
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                (ulong)*(uint *)&local_38[1].fn,0xfffffffe,(ulong)(uint)type,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/inproc/cinproc.c"
                ,0xc5);
        fflush(_stderr);
        nn_err_abort();
      }
      *(undefined4 *)&local_38[1].fn = 3;
      nn_epbase_stat_increment((nn_epbase *)&local_38[1].shutdown_fn,0xca,-1);
      nn_epbase_stat_increment((nn_epbase *)&local_38[1].shutdown_fn,0x65,1);
    }
    else {
      if (src != 0x6c41) {
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
                (ulong)*(uint *)&local_38[1].fn,(ulong)(uint)src,(ulong)(uint)type,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/inproc/cinproc.c"
                ,0xd8);
        fflush(_stderr);
        nn_err_abort();
      }
      if (type != 1) {
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                (ulong)*(uint *)&local_38[1].fn,0x6c41,(ulong)(uint)type,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/inproc/cinproc.c"
                ,0xd4);
        fflush(_stderr);
        nn_err_abort();
      }
      nn_sinproc_accept((nn_sinproc *)&local_38[1].stopped,(nn_sinproc *)srcptr);
      *(undefined4 *)&local_38[1].fn = 3;
      nn_epbase_stat_increment((nn_epbase *)&local_38[1].shutdown_fn,0xca,-1);
      nn_epbase_stat_increment((nn_epbase *)&local_38[1].shutdown_fn,0x65,1);
    }
  }
  else {
    if (iVar1 != 3) {
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected state",
              (ulong)*(uint *)&local_38[1].fn,(ulong)(uint)src,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/inproc/cinproc.c"
              ,0xf7);
      fflush(_stderr);
      nn_err_abort();
    }
    if (src != 1) {
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
              (ulong)*(uint *)&local_38[1].fn,(ulong)(uint)src,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/inproc/cinproc.c"
              ,0xf0);
      fflush(_stderr);
      nn_err_abort();
    }
    if (type != 6) {
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
              (ulong)*(uint *)&local_38[1].fn,1,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/inproc/cinproc.c"
              ,0xec);
      fflush(_stderr);
      nn_err_abort();
    }
    *(undefined4 *)&local_38[1].fn = 2;
    nn_epbase_stat_increment((nn_epbase *)&local_38[1].shutdown_fn,0xca,1);
    nn_sinproc_init((nn_sinproc *)&local_38[1].stopped,1,(nn_epbase *)&local_38[1].shutdown_fn,
                    local_38);
  }
  return;
}

Assistant:

static void nn_cinproc_handler (struct nn_fsm *self, int src, int type,
    void *srcptr)
{
    struct nn_cinproc *cinproc;
    struct nn_sinproc *sinproc;

    cinproc = nn_cont (self, struct nn_cinproc, fsm);


    switch (cinproc->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/******************************************************************************/
    case NN_CINPROC_STATE_IDLE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                cinproc->state = NN_CINPROC_STATE_DISCONNECTED;
                nn_epbase_stat_increment (&cinproc->item.epbase,
                    NN_STAT_INPROGRESS_CONNECTIONS, 1);
                return;
            default:
                nn_fsm_bad_action (cinproc->state, src, type);
            }

        default:
            nn_fsm_bad_source (cinproc->state, src, type);
        }

/******************************************************************************/
/*  DISCONNECTED state.                                                       */
/******************************************************************************/
    case NN_CINPROC_STATE_DISCONNECTED:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_CINPROC_ACTION_CONNECT:
                cinproc->state = NN_CINPROC_STATE_ACTIVE;
                nn_epbase_stat_increment (&cinproc->item.epbase,
                    NN_STAT_INPROGRESS_CONNECTIONS, -1);
                nn_epbase_stat_increment (&cinproc->item.epbase,
                    NN_STAT_ESTABLISHED_CONNECTIONS, 1);
                return;
            default:
                nn_fsm_bad_action (cinproc->state, src, type);
            }

        case NN_SINPROC_SRC_PEER:
            sinproc = (struct nn_sinproc*) srcptr;
            switch (type) {
            case NN_SINPROC_CONNECT:
                nn_sinproc_accept (&cinproc->sinproc, sinproc);
                cinproc->state = NN_CINPROC_STATE_ACTIVE;
                nn_epbase_stat_increment (&cinproc->item.epbase,
                    NN_STAT_INPROGRESS_CONNECTIONS, -1);
                nn_epbase_stat_increment (&cinproc->item.epbase,
                    NN_STAT_ESTABLISHED_CONNECTIONS, 1);
                return;
            default:
                nn_fsm_bad_action (cinproc->state, src, type);
            }

        default:
            nn_fsm_bad_source (cinproc->state, src, type);
        }

/******************************************************************************/
/*  ACTIVE state.                                                             */
/******************************************************************************/
    case NN_CINPROC_STATE_ACTIVE:
        switch (src) {
        case NN_CINPROC_SRC_SINPROC:
            switch (type) {
            case NN_SINPROC_DISCONNECT:
                cinproc->state = NN_CINPROC_STATE_DISCONNECTED;
                nn_epbase_stat_increment (&cinproc->item.epbase,
                    NN_STAT_INPROGRESS_CONNECTIONS, 1);

                nn_sinproc_init (&cinproc->sinproc, NN_CINPROC_SRC_SINPROC,
                    &cinproc->item.epbase, &cinproc->fsm);
                return;

            default:
                nn_fsm_bad_action (cinproc->state, src, type);
            }

        default:
            nn_fsm_bad_source (cinproc->state, src, type);
        }

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (cinproc->state, src, type);
    }
}